

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int mbedtls_pk_parse_public_keyfile(mbedtls_pk_context *ctx,char *path)

{
  int iVar1;
  size_t sVar2;
  uchar *buf;
  size_t n;
  uchar *local_30;
  size_t local_28;
  
  iVar1 = mbedtls_pk_load_file(path,&local_30,&local_28);
  if (iVar1 == 0) {
    iVar1 = mbedtls_pk_parse_public_key(ctx,local_30,local_28);
    if (local_28 != 0) {
      sVar2 = 0;
      do {
        local_30[sVar2] = '\0';
        sVar2 = sVar2 + 1;
      } while (local_28 != sVar2);
    }
    free(local_30);
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_keyfile( mbedtls_pk_context *ctx, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_pk_parse_public_key( ctx, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}